

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O0

callback<void_()> * __thiscall
booster::callback<void()>::operator=
          (callback<void_()> *this,unique_ptr<mycall,_std::default_delete<mycall>_> *c)

{
  callable<void_()> *in_RDI;
  intrusive_ptr<booster::callable<void_()>_> *unaff_retaddr;
  callable<void_()> *rhs;
  
  rhs = in_RDI;
  intrusive_ptr<booster::callable<void_()>_>::operator=(unaff_retaddr,in_RDI);
  std::unique_ptr<mycall,_std::default_delete<mycall>_>::release
            ((unique_ptr<mycall,_std::default_delete<mycall>_> *)0x10ddc0);
  intrusive_ptr<booster::callable<void_()>_>::operator=(unaff_retaddr,rhs);
  return (callback<void_()> *)in_RDI;
}

Assistant:

callback const &operator=(std::unique_ptr<Call> c)		
		{ call_ptr = 0; call_ptr = c.release(); return *this; }